

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall aiMesh::~aiMesh(aiMesh *this)

{
  aiBone **ppaVar1;
  aiBone *this_00;
  aiAnimMesh **ppaVar2;
  aiAnimMesh *this_01;
  aiFace *paVar3;
  uint uVar4;
  uint a;
  long lVar5;
  uint a_2;
  ulong uVar6;
  
  if (this->mVertices != (aiVector3D *)0x0) {
    operator_delete__(this->mVertices);
  }
  if (this->mNormals != (aiVector3D *)0x0) {
    operator_delete__(this->mNormals);
  }
  if (this->mTangents != (aiVector3D *)0x0) {
    operator_delete__(this->mTangents);
  }
  if (this->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(this->mBitangents);
  }
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    if (this->mTextureCoords[lVar5] != (aiVector3D *)0x0) {
      operator_delete__(this->mTextureCoords[lVar5]);
    }
  }
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    if (this->mColors[lVar5] != (aiColor4D *)0x0) {
      operator_delete__(this->mColors[lVar5]);
    }
  }
  uVar4 = this->mNumBones;
  if ((uVar4 != 0) && (this->mBones != (aiBone **)0x0)) {
    for (uVar6 = 0; ppaVar1 = this->mBones, uVar6 < uVar4; uVar6 = uVar6 + 1) {
      this_00 = ppaVar1[uVar6];
      if (this_00 != (aiBone *)0x0) {
        aiBone::~aiBone(this_00);
      }
      operator_delete(this_00);
      uVar4 = this->mNumBones;
    }
    if (ppaVar1 != (aiBone **)0x0) {
      operator_delete__(ppaVar1);
    }
  }
  uVar4 = this->mNumAnimMeshes;
  if ((uVar4 != 0) && (this->mAnimMeshes != (aiAnimMesh **)0x0)) {
    for (uVar6 = 0; ppaVar2 = this->mAnimMeshes, uVar6 < uVar4; uVar6 = uVar6 + 1) {
      this_01 = ppaVar2[uVar6];
      if (this_01 != (aiAnimMesh *)0x0) {
        aiAnimMesh::~aiAnimMesh(this_01);
      }
      operator_delete(this_01);
      uVar4 = this->mNumAnimMeshes;
    }
    if (ppaVar2 != (aiAnimMesh **)0x0) {
      operator_delete__(ppaVar2);
    }
  }
  paVar3 = this->mFaces;
  if (paVar3 != (aiFace *)0x0) {
    if (paVar3[-1].mIndices != (uint *)0x0) {
      lVar5 = (long)paVar3[-1].mIndices << 4;
      do {
        aiFace::~aiFace((aiFace *)((long)&paVar3[-1].mNumIndices + lVar5));
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != 0);
    }
    operator_delete__(&paVar3[-1].mIndices);
    return;
  }
  return;
}

Assistant:

~aiMesh() {
        delete [] mVertices;
        delete [] mNormals;
        delete [] mTangents;
        delete [] mBitangents;
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++) {
            delete [] mTextureCoords[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            delete [] mColors[a];
        }

        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if (mNumBones && mBones)    {
            for( unsigned int a = 0; a < mNumBones; a++) {
                delete mBones[a];
            }
            delete [] mBones;
        }

        if (mNumAnimMeshes && mAnimMeshes)  {
            for( unsigned int a = 0; a < mNumAnimMeshes; a++) {
                delete mAnimMeshes[a];
            }
            delete [] mAnimMeshes;
        }

        delete [] mFaces;
    }